

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

bool testing::internal::
     TypeParameterizedTest<IsStringTest,_testing::internal::TemplateSel<IsStringTest_IsString_Test>,_testing::internal::Types1<char32_t>_>
     ::Register(char *prefix,char *case_name,char *test_names,int index)

{
  char *test_case_name;
  char *type_param;
  long *plVar1;
  undefined8 *puVar2;
  char *pcVar3;
  TestFactoryBase *factory;
  long *plVar4;
  ulong *puVar5;
  ulong uVar6;
  undefined8 uVar7;
  allocator local_136;
  allocator local_135;
  int index_local;
  char *local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  ulong *local_110;
  long local_108;
  ulong local_100;
  long lStack_f8;
  string local_f0;
  char *local_d0 [2];
  char local_c0 [16];
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  char *local_70;
  char local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  index_local = index;
  std::__cxx11::string::string((string *)local_50,prefix,&local_136);
  plVar1 = (long *)std::__cxx11::string::append((char *)local_50);
  plVar4 = plVar1 + 2;
  if ((long *)*plVar1 == plVar4) {
    local_a0 = *plVar4;
    lStack_98 = plVar1[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar4;
    local_b0 = (long *)*plVar1;
  }
  local_a8 = plVar1[1];
  *plVar1 = (long)plVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar4 = plVar1 + 2;
  if ((long *)*plVar1 == plVar4) {
    local_80 = *plVar4;
    lStack_78 = plVar1[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar4;
    local_90 = (long *)*plVar1;
  }
  local_88 = plVar1[1];
  *plVar1 = (long)plVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_90);
  puVar5 = (ulong *)(plVar1 + 2);
  if ((ulong *)*plVar1 == puVar5) {
    local_100 = *puVar5;
    lStack_f8 = plVar1[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar5;
    local_110 = (ulong *)*plVar1;
  }
  local_108 = plVar1[1];
  *plVar1 = (long)puVar5;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  StreamableToString<int>(&local_f0,&index_local);
  uVar6 = 0xf;
  if (local_110 != &local_100) {
    uVar6 = local_100;
  }
  if (uVar6 < local_f0._M_string_length + local_108) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar7 = local_f0.field_2._M_allocated_capacity;
    }
    if (local_f0._M_string_length + local_108 <= (ulong)uVar7) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_110);
      goto LAB_00153cd4;
    }
  }
  puVar2 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_f0._M_dataplus._M_p);
LAB_00153cd4:
  local_130 = (char *)&local_120;
  pcVar3 = (char *)(puVar2 + 2);
  if ((char *)*puVar2 == pcVar3) {
    local_120 = *(undefined8 *)pcVar3;
    uStack_118 = puVar2[3];
  }
  else {
    local_120 = *(undefined8 *)pcVar3;
    local_130 = (char *)*puVar2;
  }
  test_case_name = local_130;
  local_128 = puVar2[1];
  *puVar2 = pcVar3;
  puVar2[1] = 0;
  *pcVar3 = '\0';
  pcVar3 = strchr(test_names,0x2c);
  if (pcVar3 == (char *)0x0) {
    std::__cxx11::string::string((string *)local_d0,test_names,&local_135);
  }
  else {
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,test_names,pcVar3);
  }
  pcVar3 = local_d0[0];
  GetTypeName<char32_t>();
  type_param = local_70;
  factory = (TestFactoryBase *)operator_new(8);
  factory->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_001daed0;
  MakeAndRegisterTestInfo
            (test_case_name,pcVar3,type_param,(char *)0x0,
             &TypeIdHelper<IsStringTest<char32_t>>::dummy_,Test::SetUpTestCase,
             Test::TearDownTestCase,factory);
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  if (local_130 != (char *)&local_120) {
    operator_delete(local_130);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return true;
}

Assistant:

static bool Register(const char* prefix, const char* case_name,
                       const char* test_names, int index) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        (std::string(prefix) + (prefix[0] == '\0' ? "" : "/") + case_name + "/"
         + StreamableToString(index)).c_str(),
        GetPrefixUntilComma(test_names).c_str(),
        GetTypeName<Type>().c_str(),
        NULL,  // No value parameter.
        GetTypeId<FixtureClass>(),
        TestClass::SetUpTestCase,
        TestClass::TearDownTestCase,
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel, typename Types::Tail>
        ::Register(prefix, case_name, test_names, index + 1);
  }